

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

string * __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::full_description(string *__return_storage_ptr__,
                  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,string *description)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_78,description," (");
  detail::readable_typename<std::__cxx11::string>();
  std::operator+(&local_58,&local_78,&local_98);
  bVar1 = this->need;
  if (bVar1 == true) {
    std::__cxx11::string::string((string *)&local_f8,"",(allocator *)&bStack_118);
  }
  else {
    std::__cxx11::string::string(local_d8,(string *)&this->def);
    std::__cxx11::string::string((string *)&local_b8,local_d8);
    std::operator+(&bStack_118," [=",&local_b8);
    std::operator+(&local_f8,&bStack_118,"]");
  }
  std::operator+(&local_38,&local_58,&local_f8);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_f8);
  if (bVar1 == false) {
    std::__cxx11::string::~string((string *)&bStack_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string(local_d8);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string full_description(const std::string &description)
			{
				return description + " (" + detail::readable_typename<T>() + (need ? "" : " [=" + detail::default_value<T>(def) + "]") + ")";
			}